

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O1

void findLeakageFlows(double lamda,double *dH,double *xQ,Network *nw)

{
  int iVar1;
  pointer ppLVar2;
  Link *pLVar3;
  Node *pNVar4;
  Node *pNVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer ppLVar9;
  ulong uVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_38;
  double dqdh;
  
  ppLVar2 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar9 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar9 != ppLVar2; ppLVar9 = ppLVar9 + 1) {
    pLVar3 = *ppLVar9;
    pLVar3->leakage = 0.0;
    local_38 = 0.0;
    iVar6 = (*(pLVar3->super_Element)._vptr_Element[0x14])(pLVar3);
    if ((char)iVar6 != '\0') {
      pNVar4 = pLVar3->fromNode;
      pNVar5 = pLVar3->toNode;
      iVar6 = (pNVar4->super_Element).index;
      iVar1 = (pNVar5->super_Element).index;
      iVar7 = (*(pNVar4->super_Element)._vptr_Element[2])(pNVar4);
      iVar8 = (*(pNVar5->super_Element)._vptr_Element[2])(pNVar5);
      if (iVar7 == 0 || iVar8 == 0) {
        dVar14 = (dH[iVar6] * lamda + pNVar4->head) - pNVar4->elev;
        dVar12 = (dH[iVar1] * lamda + pNVar5->head) - pNVar5->elev;
        if (0.0 < (dVar14 + dVar12) * 0.5) {
          (*(pLVar3->super_Element)._vptr_Element[0x15])(pLVar3,nw,&local_38);
          dVar13 = extraout_XMM0_Qa * 0.5;
          dVar11 = dVar13 + dVar13;
          if (iVar8 == 0 && iVar7 == 0) {
            uVar10 = -(ulong)(0.0 < dVar14 * dVar12);
            dVar11 = (double)(~uVar10 & (ulong)dVar11 | (ulong)dVar13 & uVar10);
          }
          pLVar3->leakage = extraout_XMM0_Qa;
          if ((iVar7 == 0) && (0.0 < dVar14)) {
            pNVar4->outflow = pNVar4->outflow + dVar11;
            pNVar4->qGrad = local_38 + pNVar4->qGrad;
            xQ[iVar6] = xQ[iVar6] - dVar11;
          }
          if ((iVar8 == 0) && (0.0 < dVar12)) {
            pNVar5->outflow = pNVar5->outflow + dVar11;
            pNVar5->qGrad = local_38 + pNVar5->qGrad;
            xQ[iVar1] = xQ[iVar1] - dVar11;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void findLeakageFlows(double lamda, double dH[], double xQ[], Network* nw)
{
    double dqdh = 0.0;  // gradient of leakage outflow w.r.t. pressure head

    for (Link* link : nw->links)
    {
        // ... skip links that don't leak

        link->leakage = 0.0;
        dqdh = 0.0;
        if ( !link->canLeak() ) continue;

        // ... identify link's end nodes and their indexes

        Node* node1 = link->fromNode;
        Node* node2 = link->toNode;
        int n1 = node1->index;
        int n2 = node2->index;

        // ... no leakage if neither end node is not a junction

        bool canLeak1 = (node1->type() == Node::JUNCTION);
        bool canLeak2 = (node2->type() == Node::JUNCTION);
        if ( !canLeak1 && !canLeak2 ) continue;

        // ... find link's average pressure head

        double h1 = node1->head + lamda * dH[n1] - node1->elev;
        double h2 = node2->head + lamda * dH[n2] - node2->elev;
        double h = (h1 + h2) / 2.0;
        if ( h <= 0.0 ) continue;

        // ... find leakage and its gradient

        link->leakage = link->findLeakage(nw, h, dqdh);

        // ... split leakage flow between end nodes, unless one cannot
        //     support leakage or has negative pressure head

        double q = link->leakage / 2.0;
        if ( h1 * h2 <= 0.0 || canLeak1 * canLeak2 == 0 ) q = 2.0 * q;

        // ... add leakage to each node's outflow

        if ( h1 > 0.0 && canLeak1 )
        {
            node1->outflow += q;
            node1->qGrad += dqdh;
            xQ[n1] -= q;
        }
        if ( h2 > 0.0 && canLeak2 )
        {
            node2->outflow += q;
            node2->qGrad += dqdh;
            xQ[n2] -= q;
        }
    }
}